

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O0

st__table *
st__init_table_with_params
          (st__compare_func_type compare,st__hash_func_type hash,int size,int density,
          double grow_factor,int reorder_flag)

{
  void *pvVar1;
  st__table *newTable;
  int i;
  int reorder_flag_local;
  double grow_factor_local;
  int density_local;
  int size_local;
  st__hash_func_type hash_local;
  st__compare_func_type compare_local;
  
  compare_local = (st__compare_func_type)malloc(0x30);
  if (compare_local == (st__compare_func_type)0x0) {
    compare_local = (st__compare_func_type)0x0;
  }
  else {
    *(st__compare_func_type *)compare_local = compare;
    *(st__hash_func_type *)(compare_local + 8) = hash;
    *(undefined4 *)(compare_local + 0x14) = 0;
    *(int *)(compare_local + 0x18) = density;
    *(double *)(compare_local + 0x20) = grow_factor;
    *(int *)(compare_local + 0x1c) = reorder_flag;
    grow_factor_local._4_4_ = size;
    if (size < 1) {
      grow_factor_local._4_4_ = 1;
    }
    *(int *)(compare_local + 0x10) = grow_factor_local._4_4_;
    pvVar1 = malloc((long)grow_factor_local._4_4_ << 3);
    *(void **)(compare_local + 0x28) = pvVar1;
    if (*(long *)(compare_local + 0x28) == 0) {
      if (compare_local != (st__compare_func_type)0x0) {
        free(compare_local);
      }
      compare_local = (st__compare_func_type)0x0;
    }
    else {
      for (newTable._0_4_ = 0; (int)newTable < grow_factor_local._4_4_;
          newTable._0_4_ = (int)newTable + 1) {
        *(undefined8 *)(*(long *)(compare_local + 0x28) + (long)(int)newTable * 8) = 0;
      }
    }
  }
  return (st__table *)compare_local;
}

Assistant:

st__table *
 st__init_table_with_params( st__compare_func_type compare, st__hash_func_type hash, int size, int density, double grow_factor, int reorder_flag)
{
    int i;
    st__table *newTable;

    newTable = ABC_ALLOC( st__table, 1);
    if (newTable == NULL) {
    return NULL;
    }
    newTable->compare = compare;
    newTable->hash = hash;
    newTable->num_entries = 0;
    newTable->max_density = density;
    newTable->grow_factor = grow_factor;
    newTable->reorder_flag = reorder_flag;
    if (size <= 0) {
    size = 1;
    }
    newTable->num_bins = size;
    newTable->bins = ABC_ALLOC( st__table_entry *, size);
    if (newTable->bins == NULL) {
    ABC_FREE(newTable);
    return NULL;
    }
    for(i = 0; i < size; i++) {
    newTable->bins[i] = 0;
    }
    return newTable;
}